

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O1

void flag_message(wchar_t flag,char *name)

{
  int iVar1;
  char *pcVar2;
  ushort **ppuVar3;
  wchar_t *pwVar4;
  byte *pbVar5;
  byte *__s;
  byte bVar6;
  size_t end;
  char buf [1024];
  size_t local_448;
  char *local_440;
  char local_438 [1032];
  
  for (pwVar4 = &obj_properties[1].type; (*pwVar4 != L'\x03' || (pwVar4[3] != flag));
      pwVar4 = pwVar4 + 0x3c) {
  }
  local_440 = name;
  memset(local_438,0,0x400);
  local_448 = 0;
  __s = *(byte **)(pwVar4 + 0x30);
  if (__s != (byte *)0x0) {
    pcVar2 = strchr((char *)__s,0x7b);
    if (pcVar2 != (char *)0x0) {
      do {
        strnfcat(local_438,0x400,&local_448,"%.*s",(ulong)(uint)((int)pcVar2 - (int)__s),__s);
        __s = (byte *)(pcVar2 + 1);
        bVar6 = pcVar2[1];
        if (bVar6 != 0) {
          ppuVar3 = __ctype_b_loc();
          pbVar5 = (byte *)(pcVar2 + 2);
          do {
            if ((*(byte *)((long)*ppuVar3 + (ulong)bVar6 * 2 + 1) & 4) == 0) {
              if ((bVar6 == 0x7d) &&
                 (iVar1 = strncmp((char *)__s,"name",4), __s = pbVar5, iVar1 == 0)) {
                strnfcat(local_438,0x400,&local_448,"%s",local_440);
              }
              break;
            }
            bVar6 = *pbVar5;
            pbVar5 = pbVar5 + 1;
          } while (bVar6 != 0);
        }
        pcVar2 = strchr((char *)__s,0x7b);
      } while (pcVar2 != (char *)0x0);
    }
    strnfcat(local_438,0x400,&local_448,"%s",__s);
    msg("%s",local_438);
  }
  return;
}

Assistant:

void flag_message(int flag, char *name)
{
	struct obj_property *prop = lookup_obj_property(OBJ_PROPERTY_FLAG, flag);
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;

	/* See if we have a message */
	if (!prop->msg) return;
	in_cursor = prop->msg;

	next = strchr(in_cursor, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;
			if (strncmp(tag, "name", 4) == 0) {
				strnfcat(buf, 1024, &end, "%s", name); 
			}

		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);

	msg("%s", buf);
}